

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.hpp
# Opt level: O2

void __thiscall Lodtalk::StackPage::freed(StackPage *this)

{
  StackPage *pSVar1;
  StackPage *pSVar2;
  
  (this->headFrame).stackPointer = (uint8_t *)0x0;
  this->baseFramePointer = (uint8_t *)0x0;
  (this->headFrame).framePointer = (uint8_t *)0x0;
  pSVar1 = this->previousPage;
  pSVar2 = this->nextPage;
  if (pSVar1 != (StackPage *)0x0) {
    pSVar1->nextPage = pSVar2;
  }
  if (pSVar2 != (StackPage *)0x0) {
    pSVar2->previousPage = pSVar1;
  }
  this->previousPage = (StackPage *)0x0;
  this->nextPage = (StackPage *)0x0;
  return;
}

Assistant:

inline void freed()
    {
        baseFramePointer = nullptr;
        headFrame = StackFrame(nullptr, nullptr);

        // Remove myself from the linked list.
        if (previousPage)
            previousPage->nextPage = nextPage;
        if (nextPage)
            nextPage->previousPage = previousPage;
        previousPage = nullptr;
        nextPage = nullptr;
    }